

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_listener_start(nng_listener lid,int flags)

{
  int iVar1;
  nni_listener *local_20;
  nni_listener *l;
  
  iVar1 = nni_listener_find(&local_20,lid.id);
  if (iVar1 == 0) {
    iVar1 = nni_listener_start(local_20,flags);
    nni_listener_rele(local_20);
  }
  return iVar1;
}

Assistant:

int
nng_listener_start(nng_listener lid, int flags)
{
	nni_listener *l;
	int           rv;

	if ((rv = nni_listener_find(&l, lid.id)) != 0) {
		return (rv);
	}
	rv = nni_listener_start(l, flags);
	nni_listener_rele(l);
	return (rv);
}